

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

QPointer<QAbstractItemDelegate> __thiscall
QMap<int,_QPointer<QAbstractItemDelegate>_>::value
          (QMap<int,_QPointer<QAbstractItemDelegate>_> *this,int *key,
          QPointer<QAbstractItemDelegate> *defaultValue)

{
  int iVar1;
  long lVar2;
  undefined8 *in_RCX;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar3;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar4;
  QObject *pQVar5;
  QPointer<QAbstractItemDelegate> QVar6;
  
  lVar2 = *(long *)key;
  if ((lVar2 != 0) && (pQVar5 = *(QObject **)(lVar2 + 0x18), pQVar5 != (QObject *)0x0)) {
    iVar1 = *(int *)&(defaultValue->wp).d;
    defaultValue = (QPointer<QAbstractItemDelegate> *)(lVar2 + 0x10);
    do {
      if (iVar1 <= *(int *)(pQVar5 + 0x20)) {
        defaultValue = (QPointer<QAbstractItemDelegate> *)pQVar5;
      }
      pQVar5 = *(QObject **)(pQVar5 + (ulong)(*(int *)(pQVar5 + 0x20) < iVar1) * 8 + 0x10);
    } while (pQVar5 != (QObject *)0x0);
    if (((QObject *)defaultValue != (QObject *)(lVar2 + 0x10)) &&
       (*(int *)((long)defaultValue + 0x20) <= iVar1)) {
      pQVar4 = *(QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 **)((long)defaultValue + 0x28);
      (this->d).d.ptr = pQVar4;
      pQVar3 = *(QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 **)((long)defaultValue + 0x30);
      goto LAB_0053d64a;
    }
  }
  pQVar4 = (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
            *)*in_RCX;
  (this->d).d.ptr = pQVar4;
  pQVar3 = (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
            *)in_RCX[1];
LAB_0053d64a:
  this[1].d.d.ptr = pQVar3;
  if (pQVar4 != (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    LOCK();
    (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  QVar6.wp.value = (QObject *)defaultValue;
  QVar6.wp.d = (Data *)this;
  return (QPointer<QAbstractItemDelegate>)QVar6.wp;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }